

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O3

cpputest_longlong __thiscall MockNamedValue::getLongLongIntValue(MockNamedValue *this)

{
  SimpleString *left;
  bool bVar1;
  ulong uVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString local_30;
  
  left = &this->type_;
  SimpleString::SimpleString(&local_30,"int");
  bVar1 = operator==(left,&local_30);
  SimpleString::~SimpleString(&local_30);
  if (bVar1) {
    uVar2 = (ulong)(this->value_).intValue_;
  }
  else {
    SimpleString::SimpleString(&local_30,"unsigned int");
    bVar1 = operator==(left,&local_30);
    SimpleString::~SimpleString(&local_30);
    if (bVar1) {
      uVar2 = (ulong)(this->value_).unsignedIntValue_;
    }
    else {
      SimpleString::SimpleString(&local_30,"long int");
      bVar1 = operator==(left,&local_30);
      SimpleString::~SimpleString(&local_30);
      if (!bVar1) {
        SimpleString::SimpleString(&local_30,"unsigned long int");
        bVar1 = operator==(left,&local_30);
        SimpleString::~SimpleString(&local_30);
        if (!bVar1) {
          pUVar3 = UtestShell::getCurrent();
          pcVar4 = SimpleString::asCharString(left);
          pTVar5 = UtestShell::getCurrentTestTerminator();
          (*pUVar3->_vptr_UtestShell[9])
                    (pUVar3,"long long int",pcVar4,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                     ,0x107,pTVar5);
        }
      }
      uVar2 = (this->value_).longIntValue_;
    }
  }
  return uVar2;
}

Assistant:

cpputest_longlong MockNamedValue::getLongLongIntValue() const
{
    if(type_ == "int")
        return value_.intValue_;
    else if(type_ == "unsigned int")
        return (long long int)value_.unsignedIntValue_;
    else if(type_ == "long int")
        return value_.longIntValue_;
    else if(type_ == "unsigned long int")
        return (long long int)value_.unsignedLongIntValue_;
    else
    {
        STRCMP_EQUAL("long long int", type_.asCharString());
        return value_.longLongIntValue_;
    }
}